

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O3

void cfd::core::logger::log<void*&>(CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,void **args)

{
  bool bVar1;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  string local_58;
  void *local_38 [2];
  
  bVar1 = IsEnableLogLevel(lvl);
  if (bVar1) {
    local_38[0] = *args;
    pcVar2 = (char *)strlen(fmt);
    format_str.size_ = 0xe;
    format_str.data_ = pcVar2;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_38;
    ::fmt::v7::detail::vformat_abi_cxx11_(&local_58,(detail *)fmt,format_str,args_00);
    WriteLog(source,lvl,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}